

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this,ConfigData *param_1)

{
  pointer pcVar1;
  int iVar2;
  Level LVar3;
  What WVar4;
  OrNot OVar5;
  YesOrNo YVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined2 uVar17;
  
  YVar6 = param_1->useColour;
  this->runOrder = param_1->runOrder;
  this->useColour = YVar6;
  bVar7 = param_1->listTests;
  bVar8 = param_1->listTags;
  bVar9 = param_1->listReporters;
  bVar10 = param_1->listTestNamesOnly;
  bVar11 = param_1->showSuccessfulTests;
  bVar12 = param_1->shouldDebugBreak;
  bVar13 = param_1->noThrow;
  bVar14 = param_1->showHelp;
  bVar15 = param_1->showInvisibles;
  bVar16 = param_1->filenamesAsTags;
  uVar17 = *(undefined2 *)&param_1->field_0xa;
  iVar2 = param_1->abortAfter;
  LVar3 = param_1->verbosity;
  WVar4 = param_1->warnings;
  OVar5 = param_1->showDurations;
  this->rngSeed = param_1->rngSeed;
  this->verbosity = LVar3;
  this->warnings = WVar4;
  this->showDurations = OVar5;
  this->listTests = bVar7;
  this->listTags = bVar8;
  this->listReporters = bVar9;
  this->listTestNamesOnly = bVar10;
  this->showSuccessfulTests = bVar11;
  this->shouldDebugBreak = bVar12;
  this->noThrow = bVar13;
  this->showHelp = bVar14;
  this->showInvisibles = bVar15;
  this->filenamesAsTags = bVar16;
  *(undefined2 *)&this->field_0xa = uVar17;
  this->abortAfter = iVar2;
  (this->outputFilename)._M_dataplus._M_p = (pointer)&(this->outputFilename).field_2;
  pcVar1 = (param_1->outputFilename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->outputFilename,pcVar1,
             pcVar1 + (param_1->outputFilename)._M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (param_1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (param_1->name)._M_string_length);
  (this->processName)._M_dataplus._M_p = (pointer)&(this->processName).field_2;
  pcVar1 = (param_1->processName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->processName,pcVar1,pcVar1 + (param_1->processName)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reporterNames,&param_1->reporterNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testsOrTags,&param_1->testsOrTags);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            listTestNamesOnly( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            showInvisibles( false ),
            filenamesAsTags( false ),
            abortAfter( -1 ),
            rngSeed( 0 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing ),
            showDurations( ShowDurations::DefaultForReporter ),
            runOrder( RunTests::InDeclarationOrder ),
            useColour( UseColour::Auto )
        {}